

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  undefined8 uVar1;
  ZSTD_parameters ZVar2;
  size_t sVar3;
  size_t sVar4;
  unsigned_long_long uVar5;
  
  ZVar2 = params;
  zcs->streamStage = zcss_init;
  uVar5 = 0;
  if (params.fParams.contentSizeFlag != 0) {
    uVar5 = pss + 1;
  }
  if (pss != 0) {
    uVar5 = pss + 1;
  }
  zcs->pledgedSrcSizePlusOne = uVar5;
  sVar3 = ZSTD_checkCParams(params.cParams);
  if (sVar3 < 0xffffffffffffff89) {
    uVar1 = params.cParams._8_8_;
    (zcs->requestedParams).cParams.searchLog = (int)params.cParams._12_8_;
    (zcs->requestedParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (zcs->requestedParams).cParams.targetLength = params.cParams.targetLength;
    (zcs->requestedParams).cParams.strategy = params.cParams.strategy;
    (zcs->requestedParams).cParams.windowLog = params.cParams.windowLog;
    (zcs->requestedParams).cParams.chainLog = params.cParams.chainLog;
    (zcs->requestedParams).cParams.hashLog = (int)uVar1;
    (zcs->requestedParams).cParams.searchLog = (int)((ulong)uVar1 >> 0x20);
    (zcs->requestedParams).fParams.contentSizeFlag = (int)ZVar2.fParams._0_8_;
    (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)ZVar2.fParams._0_8_ >> 0x20);
    (zcs->requestedParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (zcs->requestedParams).compressionLevel = 0;
    sVar4 = ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
    sVar3 = 0;
    if (0xffffffffffffff88 < sVar4) {
      sVar3 = sVar4;
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}